

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

string * __thiscall
cppnet::GetFormatTime_abi_cxx11_(string *__return_storage_ptr__,cppnet *this,FormatTimeUnit unit)

{
  uint32_t len;
  char buf [24];
  uint32_t local_5c;
  char *local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  char local_38 [24];
  
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_5c = 0x18;
  GetFormatTime(local_38,&local_5c,(FormatTimeUnit)this);
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,local_38,local_38 + local_5c);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_58 == &local_48) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_47,local_48);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_40;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_58;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_47,local_48);
  }
  __return_storage_ptr__->_M_string_length = local_50;
  local_50 = 0;
  local_48 = '\0';
  local_58 = &local_48;
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFormatTime(FormatTimeUnit unit) {
    char buf[__format_time_buf_size] = {0};
    uint32_t len = __format_time_buf_size;

    GetFormatTime(buf, len, unit);
    return std::move(std::string(buf, len));
}